

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::indent(Dumper *this)

{
  int iVar1;
  long in_RDI;
  size_t i;
  size_t n;
  ulong local_18;
  
  iVar1 = *(int *)(in_RDI + 0x10);
  (**(code **)(**(long **)(in_RDI + 8) + 0x20))(*(long **)(in_RDI + 8),(long)iVar1 << 1);
  for (local_18 = 0; local_18 < (ulong)(long)iVar1; local_18 = local_18 + 1) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),"  ",2);
  }
  return;
}

Assistant:

void Dumper::indent() {
  std::size_t n = _indentation;
  _sink->reserve(2 * n);
  for (std::size_t i = 0; i < n; ++i) {
    _sink->append("  ", 2);
  }
}